

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O2

void __thiscall
duckdb::WriteAheadLog::WriteUpdate
          (WriteAheadLog *this,DataChunk *chunk,vector<unsigned_long,_true> *column_indexes)

{
  WriteAheadLogSerializer serializer;
  
  DataChunk::Verify(chunk);
  WriteAheadLogSerializer::WriteAheadLogSerializer(&serializer,this,UPDATE_TUPLE);
  Serializer::WriteProperty<duckdb::vector<unsigned_long,true>>
            (&serializer.serializer.super_Serializer,0x65,"column_indexes",column_indexes);
  Serializer::WriteProperty<duckdb::DataChunk>
            (&serializer.serializer.super_Serializer,0x66,"chunk",chunk);
  WriteAheadLogSerializer::End(&serializer);
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&serializer);
  return;
}

Assistant:

void WriteAheadLog::WriteUpdate(DataChunk &chunk, const vector<column_t> &column_indexes) {
	D_ASSERT(chunk.size() > 0);
	D_ASSERT(chunk.ColumnCount() == 2);
	D_ASSERT(chunk.data[1].GetType().id() == LogicalType::ROW_TYPE);
	chunk.Verify();

	WriteAheadLogSerializer serializer(*this, WALType::UPDATE_TUPLE);
	serializer.WriteProperty(101, "column_indexes", column_indexes);
	serializer.WriteProperty(102, "chunk", chunk);
	serializer.End();
}